

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O0

int read_bin(string *str)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  ostream *this;
  streamoff sVar4;
  char *__dest;
  void *__src;
  long lVar5;
  undefined4 *puVar6;
  fpos afStack_2a0 [4];
  int stack_offset;
  undefined8 local_298;
  string local_290 [32];
  long local_270;
  size_t last_slash_idx;
  string local_248 [48];
  long local_218;
  ifstream bin;
  string *str_local;
  
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_218,(string *)str,_Var2);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if (bVar1) {
    std::__cxx11::string::string((string *)&last_slash_idx,(string *)str);
    GetPathOrURLShortName(local_248);
    std::__cxx11::string::operator=((string *)FileName_abi_cxx11_,(string *)local_248);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::string::~string((string *)&last_slash_idx);
    local_270 = std::__cxx11::string::rfind((char)str,0x5c);
    if (local_270 != -1) {
      std::__cxx11::string::substr((ulong)local_290,(ulong)str);
      std::__cxx11::string::operator=((string *)Directory_abi_cxx11_,local_290);
      std::__cxx11::string::~string(local_290);
    }
    this = std::operator<<((ostream *)&std::cout,anon_var_dwarf_a90a);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::istream::seekg((long)&local_218,_S_beg);
    _afStack_2a0 = std::istream::tellg();
    sVar4 = std::fpos::operator_cast_to_long(afStack_2a0);
    file_size = (int)sVar4;
    std::istream::seekg((long)&local_218,_S_beg);
    std::istream::read((char *)&local_218,0x10f400);
    __dest = stack_ptr + registe_ptr->SP;
    __src = (void *)std::__cxx11::string::c_str();
    lVar5 = std::__cxx11::string::length();
    memcpy(__dest,__src,lVar5 + 1);
    lVar5 = std::__cxx11::string::length();
    if (4 < lVar5 + 1U) {
      lVar5 = std::__cxx11::string::length();
      if ((lVar5 + 1U & 3) == 0) {
        iVar3 = std::__cxx11::string::length();
        registe_ptr->SP = iVar3 + 1 + registe_ptr->SP;
        registe_ptr->SP = registe_ptr->SP - 4;
      }
      else {
        iVar3 = std::__cxx11::string::length();
        registe_ptr->SP = (iVar3 + 1U & 0xfffffffc) + 4 + registe_ptr->SP;
        registe_ptr->SP = registe_ptr->SP - 4;
      }
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&local_218);
    return 1;
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0xf4;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

int read_bin(std::string str) {
	ifstream bin(str, ios::in | ios::binary);
	
	if (bin) {
		FileName = GetPathOrURLShortName(str);
		const size_t last_slash_idx = str.rfind('\\');
		if (std::string::npos != last_slash_idx)
		{
			Directory = str.substr(0, last_slash_idx);
		}
		std::cout << "打开文件成功！" << std::endl;
		bin.seekg(0, ios::end);//移到文件尾部
		file_size = bin.tellg();//获取文件大小
		bin.seekg(0, ios::beg);//移到文件头部
		bin.read(origin_bin, file_size);
		int stack_offset;
		memcpy(stack_ptr + registe_ptr->SP, str.c_str(), str.length() + 1);//先写再加
		if (str.length() + 1 > 4) {
			if ((str.length() + 1) % 4 == 0) {//实际路径为取得长度+\x00
				stack_offset = str.length() +1;
				registe_ptr->SP += stack_offset;
				registe_ptr->SP -= 4;
			}
		else
		{
			stack_offset = 4 * ((str.length()+1) / 4) + 4;
			registe_ptr->SP += stack_offset;
			registe_ptr->SP -= 4;
		}
	}
	bin.close();
	return LVM_SUCCESS;
	}else throw(LVM_BIN_OPEN_ERROR);
}